

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void amrex::AmrMesh::ProjPeriodic(BoxList *blout,Box *domain,Array<int,_3> *is_per)

{
  const_reference pvVar1;
  Box *in_RSI;
  BoxList tmp;
  int rk;
  int rj;
  int ri;
  int nkend;
  int njend;
  int niend;
  int nkst;
  int njst;
  int nist;
  BoxList blorig;
  BoxList *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff58;
  int nzones;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  BoxList *in_stack_ffffffffffffff70;
  Box *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar2;
  int local_58;
  int local_54;
  int local_44;
  
  BoxList::BoxList((BoxList *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
  local_44 = -1;
  for (local_54 = -1; local_54 < 2; local_54 = local_54 + 1) {
    if ((local_54 == 0) ||
       (pvVar1 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
      if ((local_54 != 0) &&
         (pvVar1 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
        in_stack_ffffffffffffff6c = 0;
        in_stack_ffffffffffffff68 = local_54;
        Box::length(in_RSI,0);
        BoxList::shift((BoxList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      }
      for (local_58 = -1; local_58 < 2; local_58 = local_58 + 1) {
        if ((local_58 == 0) ||
           (pvVar1 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
          iVar2 = local_44;
          if ((local_58 != 0) &&
             (pvVar1 = std::array<int,_3UL>::operator[]
                                 ((array<int,_3UL> *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
            in_stack_ffffffffffffff64 = 1;
            in_stack_ffffffffffffff60 = local_58;
            Box::length(in_RSI,1);
            BoxList::shift((BoxList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          }
          for (; iVar2 < 2; iVar2 = iVar2 + 1) {
            nzones = iVar2;
            if ((iVar2 == 0) ||
               (pvVar1 = std::array<int,_3UL>::operator[]
                                   ((array<int,_3UL> *)
                                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                    (size_type)in_stack_ffffffffffffff38), nzones = iVar2,
               *pvVar1 != 0)) {
              iVar2 = nzones;
              if ((nzones != 0) &&
                 (pvVar1 = std::array<int,_3UL>::operator[]
                                     ((array<int,_3UL> *)
                                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                      (size_type)in_stack_ffffffffffffff38), iVar2 = nzones,
                 *pvVar1 != 0)) {
                in_stack_ffffffffffffff5c = 2;
                Box::length(in_RSI,2);
                BoxList::shift((BoxList *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c,nzones);
                in_stack_ffffffffffffff58 = nzones;
              }
              BoxList::BoxList((BoxList *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff38);
              BoxList::intersect((BoxList *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98);
              BoxList::catenate(in_stack_ffffffffffffff70,
                                (BoxList *)
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
              if ((iVar2 != 0) &&
                 (pvVar1 = std::array<int,_3UL>::operator[]
                                     ((array<int,_3UL> *)
                                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                      (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
                Box::length(in_RSI,2);
                BoxList::shift((BoxList *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
              }
              BoxList::~BoxList((BoxList *)0x10dbaa6);
            }
          }
          if ((local_58 != 0) &&
             (pvVar1 = std::array<int,_3UL>::operator[]
                                 ((array<int,_3UL> *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
            Box::length(in_RSI,1);
            BoxList::shift((BoxList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          }
        }
      }
      if ((local_54 != 0) &&
         (pvVar1 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (size_type)in_stack_ffffffffffffff38), *pvVar1 != 0)) {
        in_stack_ffffffffffffff40 = -local_54;
        in_stack_ffffffffffffff44 = 0;
        Box::length(in_RSI,0);
        BoxList::shift((BoxList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      }
    }
  }
  BoxList::~BoxList((BoxList *)0x10dbb97);
  return;
}

Assistant:

void
AmrMesh::ProjPeriodic (BoxList& blout, const Box& domain,
                       Array<int,AMREX_SPACEDIM> const& is_per)
{
    //
    // Add periodic translates to blout.
    //

    BoxList blorig(blout);

    int nist,njst,nkst;
    int niend,njend,nkend;
    nist = njst = nkst = 0;
    niend = njend = nkend = 0;
    AMREX_D_TERM( nist , =njst , =nkst ) = -1;
    AMREX_D_TERM( niend , =njend , =nkend ) = +1;

    int ri,rj,rk;
    for (ri = nist; ri <= niend; ri++)
    {
        if (ri != 0 && !is_per[0])
            continue;
        if (ri != 0 && is_per[0])
            blorig.shift(0,ri*domain.length(0));
        for (rj = njst; rj <= njend; rj++)
        {
            if (rj != 0 && !is_per[1])
                continue;
            if (rj != 0 && is_per[1])
                blorig.shift(1,rj*domain.length(1));
            for (rk = nkst; rk <= nkend; rk++)
            {
                if (rk != 0 && !is_per[2])
                    continue;
                if (rk != 0 && is_per[2])
                    blorig.shift(2,rk*domain.length(2));

                BoxList tmp(blorig);
                tmp.intersect(domain);
                blout.catenate(tmp);

                if (rk != 0 && is_per[2])
                    blorig.shift(2,-rk*domain.length(2));
            }
            if (rj != 0 && is_per[1])
                blorig.shift(1,-rj*domain.length(1));
        }
        if (ri != 0 && is_per[0])
            blorig.shift(0,-ri*domain.length(0));
    }
}